

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O0

void __thiscall glcts::anon_unknown_0::UniformType::fill(UniformType *this)

{
  GLenum GVar1;
  string *psVar2;
  int local_20 [2];
  pair<int,_int> local_18;
  UniformType *local_10;
  UniformType *this_local;
  
  local_20[1] = 1;
  local_20[0] = 1;
  local_10 = this;
  std::pair<int,_int>::pair<int,_int,_true>(&local_18,local_20 + 1,local_20);
  std::pair<int,_int>::operator=(&this->size,&local_18);
  GVar1 = this->enumType;
  if (GVar1 == 0x1404) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"int");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1404;
  }
  else if (GVar1 == 0x1405) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"uint");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1405;
    this->signedType = false;
  }
  else if (GVar1 == 0x1406) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"float");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1406;
  }
  else if (GVar1 == 0x8b50) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"vec2");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1406;
    (this->size).first = 2;
  }
  else if (GVar1 == 0x8b51) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"vec3");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1406;
    (this->size).first = 3;
  }
  else if (GVar1 == 0x8b52) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"vec4");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1406;
    (this->size).first = 4;
  }
  else if (GVar1 == 0x8b53) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"ivec2");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1404;
    (this->size).first = 2;
  }
  else if (GVar1 == 0x8b54) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"ivec3");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1404;
    (this->size).first = 3;
  }
  else if (GVar1 == 0x8b55) {
    psVar2 = (string *)std::__cxx11::string::operator=((string *)&this->strType,"ivec4");
    std::__cxx11::string::operator=((string *)&this->refStrType,psVar2);
    this->baseType = 0x1404;
    (this->size).first = 4;
  }
  else if (GVar1 == 0x8b5a) {
    std::__cxx11::string::operator=((string *)&this->strType,"mat2");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec2");
    this->baseType = 0x1406;
    (this->size).second = 2;
    (this->size).first = 2;
  }
  else if (GVar1 == 0x8b5b) {
    std::__cxx11::string::operator=((string *)&this->strType,"mat3");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec3");
    this->baseType = 0x1406;
    (this->size).second = 3;
    (this->size).first = 3;
  }
  else if (GVar1 == 0x8b5c) {
    std::__cxx11::string::operator=((string *)&this->strType,"mat4");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec4");
    this->baseType = 0x1406;
    (this->size).second = 4;
    (this->size).first = 4;
  }
  else if (GVar1 == 0x8b5e) {
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec4");
    std::__cxx11::string::operator=((string *)&this->strType,"sampler2D");
    this->baseType = 0x82e6;
  }
  else if (GVar1 == 0x8b65) {
    std::__cxx11::string::operator=((string *)&this->strType,"mat2x3");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec3");
    this->baseType = 0x1406;
    (this->size).first = 3;
    (this->size).second = 2;
  }
  else if (GVar1 == 0x8b66) {
    std::__cxx11::string::operator=((string *)&this->strType,"mat2x4");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec4");
    this->baseType = 0x1406;
    (this->size).first = 4;
    (this->size).second = 2;
  }
  else if (GVar1 == 0x8b67) {
    std::__cxx11::string::operator=((string *)&this->strType,"mat3x2");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec2");
    this->baseType = 0x1406;
    (this->size).first = 2;
    (this->size).second = 3;
  }
  else if (GVar1 == 0x8b68) {
    std::__cxx11::string::operator=((string *)&this->strType,"mat3x4");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec4");
    this->baseType = 0x1406;
    (this->size).first = 4;
    (this->size).second = 3;
  }
  else if (GVar1 == 0x8b69) {
    std::__cxx11::string::operator=((string *)&this->strType,"mat4x2");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec2");
    this->baseType = 0x1406;
    (this->size).first = 2;
    (this->size).second = 4;
  }
  else {
    if (GVar1 != 0x8b6a) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cExplicitUniformLocationTest.cpp"
                    ,0x1f6,"void glcts::(anonymous namespace)::UniformType::fill()");
    }
    std::__cxx11::string::operator=((string *)&this->strType,"mat4x3");
    std::__cxx11::string::operator=((string *)&this->refStrType,"vec3");
    this->baseType = 0x1406;
    (this->size).first = 3;
    (this->size).second = 4;
  }
  return;
}

Assistant:

void fill()
	{

		size = std::pair<int, int>(1, 1);

		switch (enumType)
		{
		case GL_SAMPLER_2D:
			refStrType = "vec4";
			strType	= "sampler2D";
			baseType   = GL_SAMPLER;
			break;
		case GL_FLOAT:
			refStrType = strType = "float";
			baseType			 = GL_FLOAT;
			break;
		case GL_INT:
			refStrType = strType = "int";
			baseType			 = GL_INT;
			break;
		case GL_UNSIGNED_INT:
			refStrType = strType = "uint";
			baseType			 = GL_UNSIGNED_INT;
			signedType			 = false;
			break;
		case GL_FLOAT_VEC2:
			refStrType = strType = "vec2";
			baseType			 = GL_FLOAT;
			size.first			 = 2;
			break;
		case GL_FLOAT_VEC3:
			refStrType = strType = "vec3";
			baseType			 = GL_FLOAT;
			size.first			 = 3;
			break;
		case GL_FLOAT_VEC4:
			refStrType = strType = "vec4";
			baseType			 = GL_FLOAT;
			size.first			 = 4;
			break;
		case GL_FLOAT_MAT2:
			strType	= "mat2";
			refStrType = "vec2";
			baseType   = GL_FLOAT;
			size.first = size.second = 2;
			break;
		case GL_FLOAT_MAT3:
			strType	= "mat3";
			refStrType = "vec3";
			baseType   = GL_FLOAT;
			size.first = size.second = 3;
			break;
		case GL_FLOAT_MAT4:
			strType	= "mat4";
			refStrType = "vec4";
			baseType   = GL_FLOAT;
			size.first = size.second = 4;
			break;
		case GL_FLOAT_MAT2x3:
			strType		= "mat2x3";
			refStrType  = "vec3";
			baseType	= GL_FLOAT;
			size.first  = 3;
			size.second = 2;
			break;
		case GL_FLOAT_MAT4x3:
			strType		= "mat4x3";
			refStrType  = "vec3";
			baseType	= GL_FLOAT;
			size.first  = 3;
			size.second = 4;
			break;
		case GL_FLOAT_MAT2x4:
			strType		= "mat2x4";
			refStrType  = "vec4";
			baseType	= GL_FLOAT;
			size.first  = 4;
			size.second = 2;
			break;
		case GL_FLOAT_MAT3x4:
			strType		= "mat3x4";
			refStrType  = "vec4";
			baseType	= GL_FLOAT;
			size.first  = 4;
			size.second = 3;
			break;
		case GL_FLOAT_MAT3x2:
			strType		= "mat3x2";
			refStrType  = "vec2";
			baseType	= GL_FLOAT;
			size.first  = 2;
			size.second = 3;
			break;
		case GL_FLOAT_MAT4x2:
			strType		= "mat4x2";
			refStrType  = "vec2";
			baseType	= GL_FLOAT;
			size.first  = 2;
			size.second = 4;
			break;
		case GL_INT_VEC2:
			refStrType = strType = "ivec2";
			baseType			 = GL_INT;
			size.first			 = 2;
			break;
		case GL_INT_VEC3:
			refStrType = strType = "ivec3";
			baseType			 = GL_INT;
			size.first			 = 3;
			break;
		case GL_INT_VEC4:
			refStrType = strType = "ivec4";
			baseType			 = GL_INT;
			size.first			 = 4;
			break;
		default:
			assert(0);
		}
	}